

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::set_optional<double>
          (Parser *this,string *name,string *alternative,double defaultValue,string *description,
          bool dominant)

{
  CmdArgument<double> *this_00;
  CmdArgument<double> *local_38;
  
  this_00 = (CmdArgument<double> *)operator_new(0xb8);
  CmdArgument<double>::CmdArgument(this_00,name,alternative,description,false,dominant);
  this_00->value = defaultValue;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,(CmdBase **)&local_38);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "", bool dominant = false) {
			auto command = new CmdArgument<T> { name, alternative, description, false, dominant };
			command->value = defaultValue;
			_commands.push_back(command);
		}